

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

char32_t jsonnet::internal::decode_utf16_surrogates
                   (LocationRange *loc,unsigned_long high,unsigned_long low)

{
  StaticError *this;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (((high & 0xfffffffffffffc00) == 0xd800) && ((low & 0xfffffffffffffc00) == 0xdc00)) {
    return ((uint)high & 0x3ff) * 0x400 + ((uint)low & 0x3ff) + L'𐀀';
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid UTF-16 bytes",0x14);
  this = (StaticError *)__cxa_allocate_exception(0x60);
  std::__cxx11::stringbuf::str();
  StaticError::StaticError(this,loc,&local_1c0);
  __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

char32_t decode_utf16_surrogates(const LocationRange &loc, const unsigned long high, const unsigned long low)
{
    if (high >= 0xd800 && high < 0xdc00 && low >= 0xdc00 && low < 0xe000) {
        return 0x10000 + ((high & 0x03ff) << 10) + (low & 0x03ff);
    } else {
        std::stringstream ss;
        ss << "Invalid UTF-16 bytes";
        throw StaticError(loc, ss.str());
    }
}